

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O1

deUint32 vk::BinaryRegistryDetail::anon_unknown_8::addAndCountNodes
                   (BinaryIndexNode *index,deUint32 baseOffset,SparseIndexNode *group)

{
  SparseIndexNode *group_00;
  deUint32 dVar1;
  uint uVar2;
  ulong uVar3;
  deUint32 baseOffset_00;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = (long)(group->children).
                super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(group->children).
                super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar5 = uVar4 & 0xffffffff;
  if (uVar5 == 0) {
    uVar2 = (uint)uVar4;
  }
  else {
    uVar3 = 0;
    do {
      group_00 = (group->children).
                 super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar3];
      baseOffset_00 = baseOffset + (int)uVar4;
      dVar1 = addAndCountNodes(index + (uVar4 & 0xffffffff),baseOffset_00,group_00);
      index[uVar3].word = group_00->word;
      if (dVar1 == 0) {
        baseOffset_00 = group_00->index;
      }
      index[uVar3].index = baseOffset_00;
      uVar2 = dVar1 + (int)uVar4;
      uVar3 = uVar3 + 1;
      uVar4 = (ulong)uVar2;
    } while (uVar5 != uVar3);
  }
  return uVar2;
}

Assistant:

deUint32 addAndCountNodes (BinaryIndexNode* index, deUint32 baseOffset, const SparseIndexNode* group)
{
	const deUint32	numLocalNodes	= (deUint32)group->children.size();
	deUint32		curOffset		= numLocalNodes;

	// Must be normalized prior to construction of final index
	DE_ASSERT(group->children.empty() || group->children.back()->word == 0);

	for (size_t childNdx = 0; childNdx < numLocalNodes; childNdx++)
	{
		const SparseIndexNode*	child		= group->children[childNdx];
		const deUint32			subtreeSize	= addAndCountNodes(index+curOffset, baseOffset+curOffset, child);

		index[childNdx].word = child->word;

		if (subtreeSize == 0)
			index[childNdx].index = child->index;
		else
		{
			DE_ASSERT(child->index == 0);
			index[childNdx].index = baseOffset+curOffset;
		}

		curOffset += subtreeSize;
	}

	return curOffset;
}